

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_DELTAC(TT_ExecContext exc,FT_Long *args)

{
  FT_Byte FVar1;
  ulong uVar2;
  FT_Long FVar3;
  ulong uVar4;
  long local_48;
  FT_Long B;
  FT_ULong P;
  FT_ULong C;
  FT_ULong A;
  FT_ULong k;
  FT_ULong nump;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  FVar3 = (*exc->func_cur_ppem)(exc);
  uVar2 = *args;
  A = 1;
  do {
    if (uVar2 < A) {
LAB_003470b5:
      exc->new_top = exc->args;
      return;
    }
    if (exc->args < 2) {
      if (exc->pedantic_hinting != '\0') {
        exc->error = 0x81;
      }
      exc->args = 0;
      goto LAB_003470b5;
    }
    exc->args = exc->args + -2;
    if ((ulong)exc->stack[exc->args + 1] < exc->cvtSize) {
      P = (ulong)exc->stack[exc->args] >> 4 & 0xf;
      FVar1 = exc->opcode;
      if (FVar1 != 's') {
        if (FVar1 == 't') {
          P = P + 0x10;
        }
        else if (FVar1 == 'u') {
          P = P + 0x20;
        }
      }
      if (FVar3 == (exc->GS).delta_base + P) {
        uVar4 = exc->stack[exc->args] & 0xf;
        local_48 = uVar4 - 8;
        if (-1 < local_48) {
          local_48 = uVar4 - 7;
        }
        (*exc->func_move_cvt)
                  (exc,exc->stack[exc->args + 1],
                   (1L << (6U - (char)(exc->GS).delta_shift & 0x3f)) * local_48);
      }
    }
    else if (exc->pedantic_hinting != '\0') {
      exc->error = 0x86;
      return;
    }
    A = A + 1;
  } while( true );
}

Assistant:

static void
  Ins_DELTAC( TT_ExecContext  exc,
              FT_Long*        args )
  {
    FT_ULong  nump, k;
    FT_ULong  A, C, P;
    FT_Long   B;


    P    = (FT_ULong)exc->func_cur_ppem( exc );
    nump = (FT_ULong)args[0];

    for ( k = 1; k <= nump; k++ )
    {
      if ( exc->args < 2 )
      {
        if ( exc->pedantic_hinting )
          exc->error = FT_THROW( Too_Few_Arguments );
        exc->args = 0;
        goto Fail;
      }

      exc->args -= 2;

      A = (FT_ULong)exc->stack[exc->args + 1];
      B = exc->stack[exc->args];

      if ( BOUNDSL( A, exc->cvtSize ) )
      {
        if ( exc->pedantic_hinting )
        {
          exc->error = FT_THROW( Invalid_Reference );
          return;
        }
      }
      else
      {
        C = ( (FT_ULong)B & 0xF0 ) >> 4;

        switch ( exc->opcode )
        {
        case 0x73:
          break;

        case 0x74:
          C += 16;
          break;

        case 0x75:
          C += 32;
          break;
        }

        C += exc->GS.delta_base;

        if ( P == C )
        {
          B = ( (FT_ULong)B & 0xF ) - 8;
          if ( B >= 0 )
            B++;
          B *= 1L << ( 6 - exc->GS.delta_shift );

          exc->func_move_cvt( exc, A, B );
        }
      }
    }

  Fail:
    exc->new_top = exc->args;
  }